

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O0

ssize_t extract_quotation(archive_string *as,char *p)

{
  char *local_28;
  char *s;
  char *p_local;
  archive_string *as_local;
  
  local_28 = p + 1;
  while (*local_28 != '\0') {
    if (*local_28 == '\\') {
      if (local_28[1] == '\0') {
        local_28 = local_28 + 1;
      }
      else {
        archive_strappend_char(as,local_28[1]);
        local_28 = local_28 + 2;
      }
    }
    else {
      if (*local_28 == '\"') break;
      archive_strappend_char(as,*local_28);
      local_28 = local_28 + 1;
    }
  }
  if (*local_28 == '\"') {
    as_local = (archive_string *)(local_28 + (1 - (long)p));
  }
  else {
    as_local = (archive_string *)0xffffffffffffffe7;
  }
  return (ssize_t)as_local;
}

Assistant:

static ssize_t
extract_quotation(struct archive_string *as, const char *p)
{
	const char *s;

	for (s = p + 1; *s;) {
		if (*s == '\\') {
			if (s[1] != '\0') {
				archive_strappend_char(as, s[1]);
				s += 2;
			} else
				s++;
		} else if (*s == '"')
			break;
		else {
			archive_strappend_char(as, s[0]);
			s++;
		}
	}
	if (*s != '"')
		return (ARCHIVE_FAILED);/* Invalid sequence. */
	return ((ssize_t)(s + 1 - p));
}